

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O2

void set_title(char *title)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_210;
  char buffer [512];
  
  iVar1 = uv_get_process_title(buffer,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 == 0) {
      iVar1 = uv_get_process_title(buffer,0x200);
      if (iVar1 == 0) {
        iVar1 = strcmp(buffer,title);
        if (iVar1 == 0) {
          return;
        }
        pcVar2 = "strcmp(buffer, title) == 0";
        uStack_210 = 0x28;
      }
      else {
        pcVar2 = "err == 0";
        uStack_210 = 0x26;
      }
    }
    else {
      pcVar2 = "err == 0";
      uStack_210 = 0x23;
    }
  }
  else {
    pcVar2 = "err == 0";
    uStack_210 = 0x20;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title.c"
          ,uStack_210,pcVar2);
  abort();
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  err = uv_set_process_title(title);
  ASSERT(err == 0);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  ASSERT(strcmp(buffer, title) == 0);
}